

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceTask_DemoLDF::run(search *sch,multi_ex *ec)

{
  bool bVar1;
  uint uVar2;
  task_data *ptVar3;
  size_type sVar4;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  action prediction;
  action pred_id;
  action oracle;
  label *lab;
  uint32_t a;
  ptag i;
  predictor P;
  task_data *data;
  action in_stack_fffffffffffffe3c;
  predictor *in_stack_fffffffffffffe40;
  example *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  example *in_stack_fffffffffffffe58;
  action in_stack_fffffffffffffe64;
  wclass *in_stack_fffffffffffffe90;
  wclass *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea4;
  wclass *in_stack_fffffffffffffea8;
  undefined1 uVar5;
  search *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffee0;
  ptag my_tag;
  v_array<COST_SENSITIVE::wclass> *this;
  search *in_stack_fffffffffffffee8;
  predictor *in_stack_fffffffffffffef0;
  uint local_108;
  uint local_104;
  predictor *in_stack_ffffffffffffff18;
  
  my_tag = (ptag)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  ptVar3 = Search::search::get_task_data<SequenceTask_DemoLDF::task_data>(in_RDI);
  Search::predictor::predictor(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,my_tag);
  for (local_104 = 0; sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI),
      local_104 < sVar4; local_104 = local_104 + 1) {
    for (local_108 = 0; uVar5 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38),
        (ulong)local_108 < ptVar3->num_actions; local_108 = local_108 + 1) {
      bVar1 = Search::search::predictNeedsExample((search *)0x3beb2f);
      if (bVar1) {
        std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,(ulong)local_104);
        VW::copy_example_data
                  (SUB41(in_stack_fffffffffffffe64 >> 0x18,0),in_stack_fffffffffffffe58,
                   (example *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
        my_update_example_indicies
                  (in_stack_fffffffffffffeb0,(bool)uVar5,
                   (example *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (uint64_t)in_stack_fffffffffffffe98,(uint64_t)in_stack_fffffffffffffe90);
      }
      this = (v_array<COST_SENSITIVE::wclass> *)&ptVar3->ldf_examples[local_108].l;
      in_stack_fffffffffffffeb0 = (search *)v_array<COST_SENSITIVE::wclass>::operator[](this,0);
      *(float *)&in_stack_fffffffffffffeb0->priv = 0.0;
      in_stack_fffffffffffffea4 = local_108 + 1;
      in_stack_fffffffffffffea8 = v_array<COST_SENSITIVE::wclass>::operator[](this,0);
      in_stack_fffffffffffffea8->class_index = in_stack_fffffffffffffea4;
      in_stack_fffffffffffffe98 = v_array<COST_SENSITIVE::wclass>::operator[](this,0);
      in_stack_fffffffffffffe98->partial_prediction = 0.0;
      in_stack_fffffffffffffe90 = v_array<COST_SENSITIVE::wclass>::operator[](this,0);
      in_stack_fffffffffffffe90->wap_value = 0.0;
    }
    std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,(ulong)local_104);
    Search::predictor::set_tag((predictor *)&stack0xffffffffffffff00,local_104 + 1);
    Search::predictor::set_input
              ((predictor *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
    Search::predictor::set_oracle(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    Search::search::get_history_length(in_RDI);
    Search::predictor::set_condition_range
              ((predictor *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (ptag)((ulong)in_stack_fffffffffffffe48 >> 0x20),(ptag)in_stack_fffffffffffffe48,
               (char)((ulong)in_stack_fffffffffffffe40 >> 0x38));
    in_stack_fffffffffffffe64 = Search::predictor::predict(in_stack_ffffffffffffff18);
    uVar2 = in_stack_fffffffffffffe64 + 1;
    in_stack_fffffffffffffe58 = (example *)Search::search::output_abi_cxx11_(in_RDI);
    in_stack_fffffffffffffe57 = std::ios::good();
    if ((in_stack_fffffffffffffe57 & 1) != 0) {
      in_stack_fffffffffffffe48 = (example *)Search::search::output_abi_cxx11_(in_RDI);
      in_stack_fffffffffffffe40 =
           (predictor *)
           std::ostream::operator<<
                     (&(in_stack_fffffffffffffe48->super_example_predict).indices.end_array,uVar2);
      std::operator<<((ostream *)in_stack_fffffffffffffe40,' ');
    }
  }
  Search::predictor::~predictor(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* data = sch.get_task_data<task_data>();
  Search::predictor P(sch, (ptag)0);
  for (ptag i = 0; i < ec.size(); i++)
  {
    for (uint32_t a = 0; a < data->num_actions; a++)
    {
      if (sch.predictNeedsExample())  // we can skip this work if `predict` won't actually use the example data
      {
        VW::copy_example_data(false, &data->ldf_examples[a], ec[i]);  // copy but leave label alone!
        // now, offset it appropriately for the action id
        my_update_example_indicies(sch, true, &data->ldf_examples[a], 28904713, 4832917 * (uint64_t)a);
      }

      // regardless of whether the example is needed or not, the class info is needed
      CS::label& lab = data->ldf_examples[a].l.cs;
      // need to tell search what the action id is, so that it can add history features correctly!
      lab.costs[0].x = 0.;
      lab.costs[0].class_index = a + 1;
      lab.costs[0].partial_prediction = 0.;
      lab.costs[0].wap_value = 0.;
    }

    action oracle = ec[i]->l.multi.label - 1;
    action pred_id = P.set_tag((ptag)(i + 1))
                         .set_input(data->ldf_examples, data->num_actions)
                         .set_oracle(oracle)
                         .set_condition_range(i, sch.get_history_length(), 'p')
                         .predict();
    action prediction = pred_id + 1;  // or ldf_examples[pred_id]->ld.costs[0].weight_index

    if (sch.output().good())
      sch.output() << prediction << ' ';
  }
}